

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_c.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinSCAN_C>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps,double *vrho,
               double *vsigma,double *vlapl,double *vtau)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double __x;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double __x_00;
  double dVar41;
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double __x_01;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  double dVar55;
  double dVar56;
  double dVar57;
  undefined8 local_328;
  undefined8 local_228;
  undefined1 local_1f8 [16];
  undefined1 local_188 [16];
  
  dVar8 = cbrt(rho);
  dVar28 = 2.4814019635975995 / dVar8;
  dVar10 = SQRT(dVar28);
  dVar9 = dVar10;
  if (dVar28 < 0.0) {
    dVar9 = sqrt(dVar28);
    dVar10 = sqrt(dVar28);
  }
  dVar10 = dVar10 * dVar10 * dVar10;
  dVar11 = 1.5393389262365056 / (dVar8 * dVar8);
  dVar51 = dVar11 * 0.123235 + dVar10 * 0.204775 + dVar9 * 3.79785 + dVar28 * 0.8969;
  dVar12 = 16.081979498692537 / dVar51 + 1.0;
  dVar13 = log(dVar12);
  dVar10 = dVar11 * 0.1241775 + dVar10 * 0.1100325 + dVar9 * 5.1785 + dVar28 * 0.905775;
  dVar14 = 29.608749977793437 / dVar10 + 1.0;
  dVar15 = log(dVar14);
  dVar36 = dVar28 * 0.053425 + 1.0;
  dVar56 = (dVar28 * 0.0278125 + 1.0) * 0.0;
  dVar11 = dVar15 * dVar56;
  dVar2 = dVar13 * dVar36 * 0.0621814;
  dVar3 = dVar28 * 0.025 + 1.0;
  auVar30._0_8_ = dVar28 * 0.04445 + 1.0;
  dVar1 = dVar11 - dVar2;
  dVar16 = exp(dVar1 * -3.258891353270929 * 9.869604401089358);
  dVar32 = dVar16 + -1.0;
  auVar30._8_8_ = dVar32;
  local_188._8_8_ = 0x3ff0000000000000;
  local_188._0_8_ = 0x3ff0000000000000;
  auVar34 = divpd(_DAT_01041040,auVar30);
  dVar17 = dVar3 * auVar34._0_8_;
  dVar31 = auVar34._8_8_ * 3.258891353270929;
  dVar43 = dVar31 * sigma * dVar17;
  dVar52 = rho * rho;
  dVar37 = 1.0 / dVar8;
  dVar49 = (dVar37 / dVar52) * 1.2599210498948732;
  dVar8 = 1.0 / (dVar8 * dVar8);
  dVar40 = dVar8 / rho;
  dVar33 = dVar8 / dVar52;
  dVar46 = (tau * dVar40 + dVar33 * sigma * -0.125) * 0.5555555555555556 * 1.8171205928321397 *
           0.34500085141213216;
  dVar50 = dVar46;
  if (0.9825535370424727 <= dVar46) {
    dVar50 = 0.9825535370424727;
  }
  dVar44 = 1.0 - dVar50;
  if (dVar46 < 1.0420321379212383) {
    dVar55 = -0.04203213792123828;
  }
  else {
    dVar55 = 1.0 - dVar46;
  }
  dVar18 = 1.0 / dVar44;
  dVar19 = dVar28 * 0.03138525 + dVar9 * 0.04445 + 1.0;
  dVar8 = dVar8 / (dVar52 * rho);
  __x_00 = dVar43 * 0.027439371595564633 * dVar49 * 4.83597586204941 + 1.0;
  if (__x_00 < 0.0) {
    dVar20 = sqrt(__x_00);
  }
  else {
    dVar20 = SQRT(__x_00);
  }
  auVar42._8_8_ = dVar37;
  auVar42._0_8_ = 0x3ff0000000000000;
  dVar4 = dVar8 * sigma;
  __x_01 = sigma * 1.5874010519681996 * 0.00842681926885735 * dVar33 + 1.0;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  auVar6._8_8_ = rho;
  auVar6._0_8_ = dVar9;
  auVar42 = divpd(auVar42,auVar6);
  dVar9 = 1.0 - 1.0 / dVar20;
  __x = dVar9 * dVar32 + 1.0;
  dVar21 = log(__x);
  dVar22 = exp(dVar50 * -0.64 * dVar18);
  dVar23 = exp(1.5 / dVar55);
  dVar24 = exp(1.0 / dVar19);
  if (__x_01 < 0.0) {
    dVar25 = sqrt(__x_01);
  }
  else {
    dVar25 = SQRT(__x_01);
  }
  dVar39 = auVar42._8_8_;
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  dVar38 = 1.0 - 1.0 / dVar25;
  dVar26 = (dVar24 + -1.0) * dVar38 + 1.0;
  dVar27 = log(dVar26);
  local_328 = 0.0;
  if (dVar28 < 0.0) {
    dVar28 = sqrt(dVar28);
  }
  else {
    dVar28 = SQRT(dVar28);
  }
  dVar5 = dVar39 * 2.519842099789747 * 0.9847450218426962;
  dVar47 = auVar42._0_8_ * 1.4422495703074083 * dVar39 * 1.720508027656199;
  dVar45 = dVar40 * 0.5555555555555556 * 1.8171205928321397 * 0.34500085141213216;
  dVar29 = dVar45;
  if (0.9825535370424727 <= dVar46) {
    dVar29 = 0.0;
  }
  dVar53 = (tau * -1.6666666666666667 * dVar33 + dVar4 / 3.0) * 0.5555555555555556 *
           1.8171205928321397 * 0.34500085141213216;
  dVar44 = dVar50 * (1.0 / (dVar44 * dVar44)) * -0.64;
  dVar50 = dVar33 * 1.8171205928321397 * 0.34500085141213216 * -0.06944444444444445;
  local_228 = 0.0;
  if (dVar46 <= 0.9825535370424727) {
    dVar57 = (double)(-(ulong)(dVar46 < 0.9825535370424727) & (ulong)dVar50);
    local_228 = (dVar57 * -0.64 * dVar18 + dVar57 * dVar44) * dVar22;
  }
  dVar41 = (double)(-(ulong)(dVar46 < 0.9825535370424727) & (ulong)dVar53);
  dVar57 = 0.0;
  if (dVar46 <= 0.9825535370424727) {
    dVar57 = (dVar29 * -0.64 * dVar18 + dVar29 * dVar44) * dVar22;
  }
  uVar7 = -(ulong)(dVar46 <= 1.0);
  dVar29 = (1.0 / (dVar19 * dVar19)) * (dVar47 * -0.007408333333333334 + dVar5 * -0.01046175);
  dVar48 = 0.0;
  if (1.0420321379212383 <= dVar46) {
    dVar48 = dVar50;
  }
  local_1f8._8_4_ = SUB84(dVar12,0);
  local_1f8._0_8_ = dVar51 * dVar51;
  local_1f8._12_4_ = (int)((ulong)dVar12 >> 0x20);
  dVar12 = (1.0 / (dVar55 * dVar55)) * -1.05;
  dVar50 = 0.0;
  dVar51 = 0.0;
  if (1.0420321379212383 <= dVar46) {
    dVar50 = dVar48 * dVar12 * dVar23;
    dVar51 = dVar45;
  }
  dVar55 = (double)(~uVar7 & ~-(ulong)(dVar46 < 1.0420321379212383) & (ulong)(dVar23 * -0.7) |
                   ~-(ulong)(0.9825535370424727 < dVar46) & (ulong)dVar22 & uVar7);
  auVar42 = divpd(local_188,local_1f8);
  dVar13 = dVar13 * dVar5 * 0.0011073470983333333;
  if (1.0420321379212383 <= dVar46) {
    local_328 = dVar51 * dVar12 * dVar23;
  }
  dVar28 = dVar39 * 1.720508027656199 * dVar28 * 1.4422495703074083;
  local_188._0_8_ = auVar42._0_8_;
  local_188._8_8_ = auVar42._8_8_;
  dVar51 = (dVar40 * 1.5393389262365056 * -0.08215666666666667 +
           dVar28 * -0.1023875 + dVar47 * -0.632975 + dVar5 * -0.29896666666666666) *
           (double)local_188._8_8_ * dVar36 * (double)local_188._0_8_;
  dVar15 = dVar39 * 0.0 * dVar15 * 0.00018311447306006544;
  dVar14 = (1.0 / (dVar10 * dVar10)) *
           (dVar40 * 1.5393389262365056 * -0.082785 +
           dVar28 * -0.05501625 + dVar47 * -0.8630833333333333 + dVar5 * -0.301925) * (1.0 / dVar14)
           * dVar56 * 0.5848223622634646;
  dVar10 = ((dVar13 + dVar51) - dVar15) - dVar14;
  auVar54._8_8_ = 1.0 / dVar20;
  auVar54._0_8_ = 0x3ff0000000000000;
  auVar35._8_8_ = __x_00;
  auVar35._0_8_ = __x;
  auVar42 = divpd(auVar54,auVar35);
  dVar56 = (dVar24 + -1.0) * ((1.0 / dVar25) / __x_01);
  dVar26 = 1.0 / dVar26;
  dVar9 = (auVar42._8_8_ *
           ((dVar37 / (dVar52 * rho)) * 1.2599210498948732 * dVar43 * -0.0640252003896508 *
            4.83597586204941 +
           dVar17 * 10.620372852424028 * dVar49 * (1.0 / (dVar32 * dVar32)) * sigma *
           0.027439371595564633 *
           dVar10 * 1.5874010519681996 * dVar16 * 9.869604401089358 * 3.0464738926897783 +
           dVar8 * auVar34._0_8_ * -0.002743937159556463 * 3.258891353270929 *
           auVar34._8_8_ * sigma * 1.2599210498948732 +
           dVar3 * (1.0 / (auVar30._0_8_ * auVar30._0_8_)) * dVar31 * 0.004878720269691391 * dVar4 *
           1.2599210498948732) * 0.25 * dVar32 +
          dVar9 * dVar10 * -3.258891353270929 * dVar16 * 9.869604401089358) * 0.0310906908696549 *
          auVar42._0_8_;
  dVar28 = (dVar37 / dVar52) * dVar17 * auVar42._8_8_ * 0.0006950474021161377 *
           auVar42._0_8_ * 2.3248947030192535 * 2.620741394208897;
  dVar8 = ((dVar2 + (1.0 / dVar19) * -0.0285764 + dVar27 * 0.0285764) - dVar11) -
          dVar21 * 0.0310906908696549;
  if (1.0 < dVar46) {
    local_228 = dVar50;
  }
  if (1.0 < dVar46) {
    dVar57 = local_328;
  }
  dVar11 = dVar1 + dVar21 * 0.0310906908696549 + dVar55 * dVar8;
  *eps = dVar11;
  *vrho = ((double)(~uVar7 & ~-(ulong)(dVar46 < 1.0420321379212383) &
                             (ulong)(dVar23 * (double)(~-(ulong)(dVar46 < 1.0420321379212383) &
                                                      (ulong)dVar53) * dVar12) |
                   ~-(ulong)(0.9825535370424727 < dVar46) &
                   (ulong)(dVar22 * (dVar41 * -0.64 * dVar18 + dVar41 * dVar44)) & uVar7) * dVar8 +
           dVar10 + dVar9 +
          (((((dVar29 * 0.0285764 +
              (-dVar29 * dVar24 * dVar38 +
              dVar4 * dVar56 * 1.8171205928321397 * 0.014225094736250906 * -0.34500085141213216) *
              0.0285764 * dVar26) - dVar13) - dVar51) + dVar15 + dVar14) - dVar9) * dVar55) * rho +
          dVar11;
  *vsigma = ((dVar33 * 1.8171205928321397 * dVar56 * 0.00015243824895787514 *
              dVar26 * 0.34500085141213216 - dVar28) * dVar55 + dVar28 + local_228 * dVar8) * rho;
  *vlapl = 0.0;
  *vtau = dVar8 * dVar57 * rho;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps, double& vrho, double& vsigma, double& vlapl, double& vtau ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_one_ov_pi;
    constexpr double t6 = constants::m_cbrt_4;
    constexpr double t40 = constants::m_cbrt_2;
    constexpr double t61 = constants::m_pi_sq;
    constexpr double t116 = constants::m_cbrt_6;
    constexpr double t118 = constants::m_cbrt_pi_sq;
    constexpr double t5 = t2 * t4;
    constexpr double t7 = t6 * t6;
    constexpr double t19 = t2 * t2;
    constexpr double t20 = t4 * t4;
    constexpr double t21 = t19 * t20;
    constexpr double t41 = t40 - 0.1e1;
    constexpr double t43 = 0.1e1 / t41 / 0.2e1;
    constexpr double t92 = 0.1e1 / t4;
    constexpr double t94 = t19 * t92 * t6;
    constexpr double t119 = t118 * t118;
    constexpr double t120 = 0.1e1 / t119;
    constexpr double t121 = t40 * t40;
    constexpr double t122 = t120 * t121;
    constexpr double t161 = t116 * t120;
    constexpr double t193 = t4 * t7;
    constexpr double t347 = t40 * t19;
    constexpr double t348 = t92 * t6;


    const double t8 = safe_math::cbrt( rho );
    const double t11 = t5 * t7 / t8;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t17 = pow_3_2( t11 );
    const double t22 = t8 * t8;
    const double t25 = t21 * t6 / t22;
    const double t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = 0.1e1 <= zeta_tol;
    const double t35 = safe_math::cbrt( zeta_tol );
    const double t37 = piecewise_functor_3( t34, t35 * zeta_tol, 1.0 );
    const double t39 = 0.2e1 * t37 - 0.2e1;
    const double t44 = t39 * t43;
    const double t46 = 0.1e1 + 0.278125e-1 * t11;
    const double t51 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
    const double t54 = 0.1e1 + 0.29608749977793437516e2 / t51;
    const double t55 = safe_math::log( t54 );
    const double t58 = 0.19751673498613801407e-1 * t44 * t46 * t55;
    const double t59 = safe_math::log( 0.2e1 );
    const double t60 = 0.1e1 - t59;
    const double t63 = t60 / t61;
    const double t64 = t35 * t35;
    const double t65 = piecewise_functor_3( t34, t64, 1.0 );
    const double t66 = t65 * t65;
    const double t67 = t66 * t65;
    const double t69 = 0.1e1 + 0.25e-1 * t11;
    const double t71 = 0.1e1 + 0.4445e-1 * t11;
    const double t72 = 0.1e1 / t71;
    const double t73 = t69 * t72;
    const double t74 = 0.1e1 / t60;
    const double t77 = 0.1e1 / t67;
    const double t78 = t61 * t77;
    const double t80 = safe_math::exp( -( -t33 + t58 ) * t74 * t78 );
    const double t81 = t80 - 0.1e1;
    const double t82 = 0.1e1 / t81;
    const double t83 = t74 * t82;
    const double t84 = t83 * sigma;
    const double t85 = t73 * t84;
    const double t86 = rho * rho;
    const double t88 = 0.1e1 / t8 / t86;
    const double t89 = t88 * t40;
    const double t90 = 0.1e1 / t66;
    const double t98 = 0.1e1 + 0.27439371595564631661e-1 * t85 * t89 * t90 * t94;
    const double t99 = pow_1_4( t98 );
    const double t101 = 0.1e1 - 0.1e1 / t99;
    const double t104 = 0.1e1 + 0.1e1 * t101 * t81;
    const double t105 = safe_math::log( t104 );
    const double t107 = t63 * t67 * t105;
    const double t109 = 0.1e1 / t22 / rho;
    const double t112 = 0.1e1 / t22 / t86;
    const double t124 = 0.5e1 / 0.9e1 * ( tau * t109 - sigma * t112 / 0.8e1 ) * t116 * t122;
    const double t125 = t124 <= 0.1e1;
    const double t126 = safe_math::log( DBL_EPSILON );
    const double t129 = t126 / ( -t126 + 0.64e0 );
    const double t130 = -t129 < t124;
    const double t131 = t124 < -t129;
    const double t132 = piecewise_functor_3( t131, t124, -t129 );
    const double t133 = 0.1e1 - t132;
    const double t134 = 0.1e1 / t133;
    const double t137 = safe_math::exp( -0.64e0 * t132 * t134 );
    const double t138 = piecewise_functor_3( t130, 0.0, t137 );
    const double t140 = safe_math::log( 0.14285714285714285714e1 * DBL_EPSILON );
    const double t143 = ( -t140 + 0.15e1 ) / t140;
    const double t144 = t124 < -t143;
    const double t145 = piecewise_functor_3( t144, -t143, t124 );
    const double t146 = 0.1e1 - t145;
    const double t149 = safe_math::exp( 0.15e1 / t146 );
    const double t151 = piecewise_functor_3( t144, 0.0, -0.7e0 * t149 );
    const double t152 = piecewise_functor_3( t125, t138, t151 );
    const double t155 = 0.1e1 + 0.4445e-1 * t14 + 0.3138525e-1 * t11;
    const double t156 = 0.1e1 / t155;
    const double t159 = safe_math::exp( 0.1e1 * t156 );
    const double t160 = t159 - 0.1e1;
    const double t162 = t121 * sigma;
    const double t166 = 0.1e1 + 0.21337642104376358333e-1 * t161 * t162 * t112;
    const double t167 = pow_1_4( t166 );
    const double t169 = 0.1e1 - 0.1e1 / t167;
    const double t171 = t160 * t169 + 0.1e1;
    const double t172 = safe_math::log( t171 );
    const double t178 = 0.1e1 - 0.2363e1 * t41 * t39 * t43;
    const double t180 = ( -0.285764e-1 * t156 + 0.285764e-1 * t172 ) * t178 + t33 - t58 - t107;
    const double t181 = t152 * t180;
    const double t183 = 0.1e1 / t8 / rho;
    const double t184 = t7 * t183;
    const double t186 = t5 * t184 * t31;
    const double t187 = 0.11073470983333333333e-2 * t186;
    const double t188 = t27 * t27;
    const double t189 = 0.1e1 / t188;
    const double t190 = t13 * t189;
    const double t192 = 0.1e1 / t14 * t2;
    const double t194 = t193 * t183;
    const double t195 = t192 * t194;
    const double t197 = t5 * t184;
    const double t199 = safe_math::sqrt( t11 );
    const double t200 = t199 * t2;
    const double t201 = t200 * t194;
    const double t204 = t21 * t6 * t109;
    const double t206 = -0.632975e0 * t195 - 0.29896666666666666667e0 * t197 - 0.1023875e0 * t201 - 0.82156666666666666667e-1 * t204;
    const double t207 = 0.1e1 / t30;
    const double t208 = t206 * t207;
    const double t209 = t190 * t208;
    const double t210 = 0.1e1 * t209;
    const double t211 = t44 * t2;
    const double t214 = t211 * t193 * t183 * t55;
    const double t215 = 0.18311447306006545054e-3 * t214;
    const double t216 = t44 * t46;
    const double t217 = t51 * t51;
    const double t218 = 0.1e1 / t217;
    const double t223 = -0.86308333333333333334e0 * t195 - 0.301925e0 * t197 - 0.5501625e-1 * t201 - 0.82785e-1 * t204;
    const double t225 = 0.1e1 / t54;
    const double t226 = t218 * t223 * t225;
    const double t227 = t216 * t226;
    const double t228 = 0.5848223622634646207e0 * t227;
    const double t230 = 0.1e1 / t99 / t98;
    const double t231 = t86 * rho;
    const double t233 = 0.1e1 / t22 / t231;
    const double t234 = t233 * t72;
    const double t237 = t40 * t90;
    const double t238 = t82 * sigma * t237;
    const double t241 = t71 * t71;
    const double t242 = 0.1e1 / t241;
    const double t243 = t69 * t242;
    const double t244 = t243 * t83;
    const double t245 = sigma * t233;
    const double t249 = t60 * t60;
    const double t250 = 0.1e1 / t249;
    const double t251 = t73 * t250;
    const double t252 = t81 * t81;
    const double t253 = 0.1e1 / t252;
    const double t254 = t253 * sigma;
    const double t255 = t254 * t89;
    const double t256 = t251 * t255;
    const double t257 = t66 * t66;
    const double t259 = 0.1e1 / t257 / t65;
    const double t260 = t259 * t19;
    const double t261 = t260 * t92;
    const double t262 = t187 + t210 - t215 - t228;
    const double t264 = t61 * t80;
    const double t265 = t6 * t262 * t264;
    const double t266 = t261 * t265;
    const double t270 = 0.1e1 / t8 / t231;
    const double t271 = t270 * t40;
    const double t276 = -0.27439371595564631661e-2 * t234 * t74 * t238 + 0.48787202696913915093e-2 * t244 * t245 * t237 + 0.27439371595564631661e-1 * t256 * t266 - 0.64025200389650807209e-1 * t85 * t271 * t90 * t94;
    const double t277 = t230 * t276;
    const double t282 = t78 * t80;
    const double t285 = 0.25e0 * t277 * t81 - 0.1e1 * t101 * t262 * t74 * t282;
    const double t287 = 0.1e1 / t104;
    const double t289 = t63 * t67 * t285 * t287;
    const double t296 = 0.5e1 / 0.9e1 * ( -0.5e1 / 0.3e1 * tau * t112 + t245 / 0.3e1 ) * t116 * t122;
    const double t297 = piecewise_functor_3( t131, t296, 0.0 );
    const double t300 = t133 * t133;
    const double t301 = 0.1e1 / t300;
    const double t302 = t132 * t301;
    const double t305 = -0.64e0 * t297 * t134 - 0.64e0 * t302 * t297;
    const double t306 = t305 * t137;
    const double t307 = piecewise_functor_3( t130, 0.0, t306 );
    const double t308 = t146 * t146;
    const double t309 = 0.1e1 / t308;
    const double t310 = piecewise_functor_3( t144, 0.0, t296 );
    const double t314 = piecewise_functor_3( t144, 0.0, -0.105e1 * t309 * t310 * t149 );
    const double t315 = piecewise_functor_3( t125, t307, t314 );
    const double t316 = t315 * t180;
    const double t317 = t155 * t155;
    const double t318 = 0.1e1 / t317;
    const double t321 = -0.74083333333333333333e-2 * t195 - 0.1046175e-1 * t197;
    const double t322 = t318 * t321;
    const double t324 = t159 * t169;
    const double t328 = 0.1e1 / t167 / t166;
    const double t329 = t160 * t328;
    const double t330 = t329 * t116;
    const double t334 = -0.1e1 * t322 * t324 - 0.14225094736250905555e-1 * t330 * t122 * t245;
    const double t335 = 0.1e1 / t171;
    const double t340 = ( 0.285764e-1 * t322 + 0.285764e-1 * t334 * t335 ) * t178 - t187 - t210 + t215 + t228 - t289;
    const double t341 = t152 * t340;
    const double t344 = t65 * t230;
    const double t345 = t73 * t88;
    const double t346 = t344 * t345;
    const double t349 = t348 * t287;
    const double t350 = t347 * t349;
    const double t352 = 0.69504740211613770831e-3 * t346 * t350;
    const double t353 = t112 * t116;
    const double t354 = t353 * t122;
    const double t355 = 0.5e1 / 0.72e2 * t354;
    const double t356 = piecewise_functor_3( t131, -t355, 0.0 );
    const double t361 = -0.64e0 * t356 * t134 - 0.64e0 * t302 * t356;
    const double t362 = t361 * t137;
    const double t363 = piecewise_functor_3( t130, 0.0, t362 );
    const double t364 = piecewise_functor_3( t144, 0.0, -t355 );
    const double t368 = piecewise_functor_3( t144, 0.0, -0.105e1 * t309 * t364 * t149 );
    const double t369 = piecewise_functor_3( t125, t363, t368 );
    const double t370 = t369 * t180;
    const double t371 = t329 * t353;
    const double t372 = t335 * t178;
    const double t373 = t122 * t372;
    const double t376 = 0.15243824895787514157e-3 * t371 * t373 - t352;
    const double t377 = t152 * t376;
    const double t381 = 0.5e1 / 0.9e1 * t109 * t116 * t122;
    const double t382 = piecewise_functor_3( t131, t381, 0.0 );
    const double t387 = -0.64e0 * t382 * t134 - 0.64e0 * t302 * t382;
    const double t388 = t387 * t137;
    const double t389 = piecewise_functor_3( t130, 0.0, t388 );
    const double t390 = piecewise_functor_3( t144, 0.0, t381 );
    const double t394 = piecewise_functor_3( t144, 0.0, -0.105e1 * t309 * t390 * t149 );
    const double t395 = piecewise_functor_3( t125, t389, t394 );
    const double t396 = rho * t395;


    eps = -t33 + t58 + t107 + t181;
    vrho = -t33 + t58 + t107 + t181 + rho * ( t187 + t210 - t215 - t228 + t289 + t316 + t341 );
    vsigma = rho * ( t352 + t370 + t377 );
    vlapl = 0.e0;
    vtau = t396 * t180;

  }